

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# param-utils.cpp
# Opt level: O1

SortedVector *
wasm::ParamUtils::applyConstantValues
          (SortedVector *__return_storage_ptr__,
          vector<wasm::Function_*,_std::allocator<wasm::Function_*>_> *funcs,
          vector<wasm::Call_*,_std::allocator<wasm::Call_*>_> *calls,
          vector<wasm::CallRef_*,_std::allocator<wasm::CallRef_*>_> *callRefs,Module *module)

{
  Function *pFVar1;
  pointer ppCVar2;
  pointer ppCVar3;
  pointer ppFVar4;
  pointer ppFVar5;
  size_t sVar6;
  Expression *value_00;
  LocalSet *left;
  Block *pBVar7;
  pointer ppFVar8;
  vector<wasm::CallRef_*,_std::allocator<wasm::CallRef_*>_> *__range3_1;
  Index x;
  ulong uVar9;
  pointer ppCVar10;
  pointer ppCVar11;
  optional<wasm::Type> type;
  vector<wasm::Call_*,_std::allocator<wasm::Call_*>_> *__range3;
  vector<wasm::Function_*,_std::allocator<wasm::Function_*>_> *__range3_2;
  undefined1 local_60 [8];
  PossibleConstantValues value;
  Builder builder;
  
  ppFVar5 = (funcs->super__Vector_base<wasm::Function_*,_std::allocator<wasm::Function_*>_>)._M_impl
            .super__Vector_impl_data._M_start;
  ppFVar8 = (funcs->super__Vector_base<wasm::Function_*,_std::allocator<wasm::Function_*>_>)._M_impl
            .super__Vector_impl_data._M_finish;
  if (ppFVar8 == ppFVar5) {
    __assert_fail("funcs.size() > 0",
                  "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/passes/param-utils.cpp"
                  ,0xf6,
                  "SortedVector wasm::ParamUtils::applyConstantValues(const std::vector<Function *> &, const std::vector<Call *> &, const std::vector<CallRef *> &, Module *)"
                 );
  }
  pFVar1 = *ppFVar5;
  do {
    if (((*ppFVar5)->type).id != (pFVar1->type).id) {
      __assert_fail("func->type == first->type",
                    "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/passes/param-utils.cpp"
                    ,0xfa,
                    "SortedVector wasm::ParamUtils::applyConstantValues(const std::vector<Function *> &, const std::vector<Call *> &, const std::vector<CallRef *> &, Module *)"
                   );
    }
    ppFVar5 = ppFVar5 + 1;
  } while (ppFVar5 != ppFVar8);
  (__return_storage_ptr__->super_vector<unsigned_int,_std::allocator<unsigned_int>_>).
  super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  (__return_storage_ptr__->super_vector<unsigned_int,_std::allocator<unsigned_int>_>).
  super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  (__return_storage_ptr__->super_vector<unsigned_int,_std::allocator<unsigned_int>_>).
  super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  sVar6 = Function::getNumParams(pFVar1);
  if (sVar6 != 0) {
    uVar9 = 0;
    do {
      value.value.
      super__Variant_base<wasm::PossibleConstantValues::None,_wasm::Literal,_wasm::Name,_wasm::PossibleConstantValues::Many>
      .
      super__Move_assign_alias<wasm::PossibleConstantValues::None,_wasm::Literal,_wasm::Name,_wasm::PossibleConstantValues::Many>
      .
      super__Copy_assign_alias<wasm::PossibleConstantValues::None,_wasm::Literal,_wasm::Name,_wasm::PossibleConstantValues::Many>
      .
      super__Move_ctor_alias<wasm::PossibleConstantValues::None,_wasm::Literal,_wasm::Name,_wasm::PossibleConstantValues::Many>
      .
      super__Copy_ctor_alias<wasm::PossibleConstantValues::None,_wasm::Literal,_wasm::Name,_wasm::PossibleConstantValues::Many>
      .
      super__Variant_storage_alias<wasm::PossibleConstantValues::None,_wasm::Literal,_wasm::Name,_wasm::PossibleConstantValues::Many>
      ._M_u._16_1_ = 0;
      ppCVar2 = (calls->super__Vector_base<wasm::Call_*,_std::allocator<wasm::Call_*>_>)._M_impl.
                super__Vector_impl_data._M_finish;
      for (ppCVar10 = (calls->super__Vector_base<wasm::Call_*,_std::allocator<wasm::Call_*>_>).
                      _M_impl.super__Vector_impl_data._M_start; ppCVar10 != ppCVar2;
          ppCVar10 = ppCVar10 + 1) {
        if (((*ppCVar10)->operands).
            super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>.usedElements
            <= uVar9) goto LAB_0077ce2b;
        PossibleConstantValues::note
                  ((PossibleConstantValues *)local_60,
                   ((*ppCVar10)->operands).
                   super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>.data
                   [uVar9],module);
        if ((value.value.
             super__Variant_base<wasm::PossibleConstantValues::None,_wasm::Literal,_wasm::Name,_wasm::PossibleConstantValues::Many>
             .
             super__Move_assign_alias<wasm::PossibleConstantValues::None,_wasm::Literal,_wasm::Name,_wasm::PossibleConstantValues::Many>
             .
             super__Copy_assign_alias<wasm::PossibleConstantValues::None,_wasm::Literal,_wasm::Name,_wasm::PossibleConstantValues::Many>
             .
             super__Move_ctor_alias<wasm::PossibleConstantValues::None,_wasm::Literal,_wasm::Name,_wasm::PossibleConstantValues::Many>
             .
             super__Copy_ctor_alias<wasm::PossibleConstantValues::None,_wasm::Literal,_wasm::Name,_wasm::PossibleConstantValues::Many>
             .
             super__Variant_storage_alias<wasm::PossibleConstantValues::None,_wasm::Literal,_wasm::Name,_wasm::PossibleConstantValues::Many>
             ._M_u._16_1_ == '\0') ||
           (value.value.
            super__Variant_base<wasm::PossibleConstantValues::None,_wasm::Literal,_wasm::Name,_wasm::PossibleConstantValues::Many>
            .
            super__Move_assign_alias<wasm::PossibleConstantValues::None,_wasm::Literal,_wasm::Name,_wasm::PossibleConstantValues::Many>
            .
            super__Copy_assign_alias<wasm::PossibleConstantValues::None,_wasm::Literal,_wasm::Name,_wasm::PossibleConstantValues::Many>
            .
            super__Move_ctor_alias<wasm::PossibleConstantValues::None,_wasm::Literal,_wasm::Name,_wasm::PossibleConstantValues::Many>
            .
            super__Copy_ctor_alias<wasm::PossibleConstantValues::None,_wasm::Literal,_wasm::Name,_wasm::PossibleConstantValues::Many>
            .
            super__Variant_storage_alias<wasm::PossibleConstantValues::None,_wasm::Literal,_wasm::Name,_wasm::PossibleConstantValues::Many>
            ._M_u._16_1_ == '\x03')) break;
      }
      ppCVar3 = (callRefs->super__Vector_base<wasm::CallRef_*,_std::allocator<wasm::CallRef_*>_>).
                _M_impl.super__Vector_impl_data._M_finish;
      for (ppCVar11 = (callRefs->
                      super__Vector_base<wasm::CallRef_*,_std::allocator<wasm::CallRef_*>_>)._M_impl
                      .super__Vector_impl_data._M_start; ppCVar11 != ppCVar3;
          ppCVar11 = ppCVar11 + 1) {
        if (((*ppCVar11)->operands).
            super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>.usedElements
            <= uVar9) {
LAB_0077ce2b:
          __assert_fail("index < usedElements",
                        "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/mixed_arena.h"
                        ,0xbc,
                        "T &ArenaVectorBase<ArenaVector<wasm::Expression *>, wasm::Expression *>::operator[](size_t) const [SubType = ArenaVector<wasm::Expression *>, T = wasm::Expression *]"
                       );
        }
        PossibleConstantValues::note
                  ((PossibleConstantValues *)local_60,
                   ((*ppCVar11)->operands).
                   super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>.data
                   [uVar9],module);
        if ((value.value.
             super__Variant_base<wasm::PossibleConstantValues::None,_wasm::Literal,_wasm::Name,_wasm::PossibleConstantValues::Many>
             .
             super__Move_assign_alias<wasm::PossibleConstantValues::None,_wasm::Literal,_wasm::Name,_wasm::PossibleConstantValues::Many>
             .
             super__Copy_assign_alias<wasm::PossibleConstantValues::None,_wasm::Literal,_wasm::Name,_wasm::PossibleConstantValues::Many>
             .
             super__Move_ctor_alias<wasm::PossibleConstantValues::None,_wasm::Literal,_wasm::Name,_wasm::PossibleConstantValues::Many>
             .
             super__Copy_ctor_alias<wasm::PossibleConstantValues::None,_wasm::Literal,_wasm::Name,_wasm::PossibleConstantValues::Many>
             .
             super__Variant_storage_alias<wasm::PossibleConstantValues::None,_wasm::Literal,_wasm::Name,_wasm::PossibleConstantValues::Many>
             ._M_u._16_1_ == '\0') ||
           (value.value.
            super__Variant_base<wasm::PossibleConstantValues::None,_wasm::Literal,_wasm::Name,_wasm::PossibleConstantValues::Many>
            .
            super__Move_assign_alias<wasm::PossibleConstantValues::None,_wasm::Literal,_wasm::Name,_wasm::PossibleConstantValues::Many>
            .
            super__Copy_assign_alias<wasm::PossibleConstantValues::None,_wasm::Literal,_wasm::Name,_wasm::PossibleConstantValues::Many>
            .
            super__Move_ctor_alias<wasm::PossibleConstantValues::None,_wasm::Literal,_wasm::Name,_wasm::PossibleConstantValues::Many>
            .
            super__Copy_ctor_alias<wasm::PossibleConstantValues::None,_wasm::Literal,_wasm::Name,_wasm::PossibleConstantValues::Many>
            .
            super__Variant_storage_alias<wasm::PossibleConstantValues::None,_wasm::Literal,_wasm::Name,_wasm::PossibleConstantValues::Many>
            ._M_u._16_1_ == '\x03')) break;
      }
      x = (Index)uVar9;
      if ((value.value.
           super__Variant_base<wasm::PossibleConstantValues::None,_wasm::Literal,_wasm::Name,_wasm::PossibleConstantValues::Many>
           .
           super__Move_assign_alias<wasm::PossibleConstantValues::None,_wasm::Literal,_wasm::Name,_wasm::PossibleConstantValues::Many>
           .
           super__Copy_assign_alias<wasm::PossibleConstantValues::None,_wasm::Literal,_wasm::Name,_wasm::PossibleConstantValues::Many>
           .
           super__Move_ctor_alias<wasm::PossibleConstantValues::None,_wasm::Literal,_wasm::Name,_wasm::PossibleConstantValues::Many>
           .
           super__Copy_ctor_alias<wasm::PossibleConstantValues::None,_wasm::Literal,_wasm::Name,_wasm::PossibleConstantValues::Many>
           .
           super__Variant_storage_alias<wasm::PossibleConstantValues::None,_wasm::Literal,_wasm::Name,_wasm::PossibleConstantValues::Many>
           ._M_u._16_1_ != '\0') &&
         (value.value.
          super__Variant_base<wasm::PossibleConstantValues::None,_wasm::Literal,_wasm::Name,_wasm::PossibleConstantValues::Many>
          .
          super__Move_assign_alias<wasm::PossibleConstantValues::None,_wasm::Literal,_wasm::Name,_wasm::PossibleConstantValues::Many>
          .
          super__Copy_assign_alias<wasm::PossibleConstantValues::None,_wasm::Literal,_wasm::Name,_wasm::PossibleConstantValues::Many>
          .
          super__Move_ctor_alias<wasm::PossibleConstantValues::None,_wasm::Literal,_wasm::Name,_wasm::PossibleConstantValues::Many>
          .
          super__Copy_ctor_alias<wasm::PossibleConstantValues::None,_wasm::Literal,_wasm::Name,_wasm::PossibleConstantValues::Many>
          .
          super__Variant_storage_alias<wasm::PossibleConstantValues::None,_wasm::Literal,_wasm::Name,_wasm::PossibleConstantValues::Many>
          ._M_u._16_1_ != '\x03')) {
        ppFVar4 = (funcs->super__Vector_base<wasm::Function_*,_std::allocator<wasm::Function_*>_>).
                  _M_impl.super__Vector_impl_data._M_finish;
        value.value.
        super__Variant_base<wasm::PossibleConstantValues::None,_wasm::Literal,_wasm::Name,_wasm::PossibleConstantValues::Many>
        .
        super__Move_assign_alias<wasm::PossibleConstantValues::None,_wasm::Literal,_wasm::Name,_wasm::PossibleConstantValues::Many>
        .
        super__Copy_assign_alias<wasm::PossibleConstantValues::None,_wasm::Literal,_wasm::Name,_wasm::PossibleConstantValues::Many>
        .
        super__Move_ctor_alias<wasm::PossibleConstantValues::None,_wasm::Literal,_wasm::Name,_wasm::PossibleConstantValues::Many>
        .
        super__Copy_ctor_alias<wasm::PossibleConstantValues::None,_wasm::Literal,_wasm::Name,_wasm::PossibleConstantValues::Many>
        .
        super__Variant_storage_alias<wasm::PossibleConstantValues::None,_wasm::Literal,_wasm::Name,_wasm::PossibleConstantValues::Many>
        ._24_8_ = module;
        for (ppFVar5 = (funcs->
                       super__Vector_base<wasm::Function_*,_std::allocator<wasm::Function_*>_>).
                       _M_impl.super__Vector_impl_data._M_start; ppFVar5 != ppFVar4;
            ppFVar5 = ppFVar5 + 1) {
          pFVar1 = *ppFVar5;
          value_00 = PossibleConstantValues::makeExpression
                               ((PossibleConstantValues *)local_60,module);
          left = Builder::makeLocalSet
                           ((Builder *)
                            ((long)&value.value.
                                    super__Variant_base<wasm::PossibleConstantValues::None,_wasm::Literal,_wasm::Name,_wasm::PossibleConstantValues::Many>
                                    .
                                    super__Move_assign_alias<wasm::PossibleConstantValues::None,_wasm::Literal,_wasm::Name,_wasm::PossibleConstantValues::Many>
                                    .
                                    super__Copy_assign_alias<wasm::PossibleConstantValues::None,_wasm::Literal,_wasm::Name,_wasm::PossibleConstantValues::Many>
                                    .
                                    super__Move_ctor_alias<wasm::PossibleConstantValues::None,_wasm::Literal,_wasm::Name,_wasm::PossibleConstantValues::Many>
                                    .
                                    super__Copy_ctor_alias<wasm::PossibleConstantValues::None,_wasm::Literal,_wasm::Name,_wasm::PossibleConstantValues::Many>
                            + 0x18),x,value_00);
          type.super__Optional_base<wasm::Type,_true,_true>._M_payload.
          super__Optional_payload_base<wasm::Type>._8_8_ = 0;
          type.super__Optional_base<wasm::Type,_true,_true>._M_payload.
          super__Optional_payload_base<wasm::Type>._M_payload = (_Storage<wasm::Type,_true>)ppFVar8;
          pBVar7 = Builder::makeSequence
                             ((Builder *)
                              ((long)&value.value.
                                      super__Variant_base<wasm::PossibleConstantValues::None,_wasm::Literal,_wasm::Name,_wasm::PossibleConstantValues::Many>
                                      .
                                      super__Move_assign_alias<wasm::PossibleConstantValues::None,_wasm::Literal,_wasm::Name,_wasm::PossibleConstantValues::Many>
                                      .
                                      super__Copy_assign_alias<wasm::PossibleConstantValues::None,_wasm::Literal,_wasm::Name,_wasm::PossibleConstantValues::Many>
                                      .
                                      super__Move_ctor_alias<wasm::PossibleConstantValues::None,_wasm::Literal,_wasm::Name,_wasm::PossibleConstantValues::Many>
                                      .
                                      super__Copy_ctor_alias<wasm::PossibleConstantValues::None,_wasm::Literal,_wasm::Name,_wasm::PossibleConstantValues::Many>
                              + 0x18),(Expression *)left,pFVar1->body,type);
          pFVar1->body = (Expression *)pBVar7;
        }
        SortedVector::insert(__return_storage_ptr__,x);
      }
      std::__detail::__variant::
      _Variant_storage<false,_wasm::PossibleConstantValues::None,_wasm::Literal,_wasm::Name,_wasm::PossibleConstantValues::Many>
      ::~_Variant_storage((_Variant_storage<false,_wasm::PossibleConstantValues::None,_wasm::Literal,_wasm::Name,_wasm::PossibleConstantValues::Many>
                           *)local_60);
      uVar9 = (ulong)(x + 1);
    } while (uVar9 < sVar6);
  }
  return __return_storage_ptr__;
}

Assistant:

SortedVector applyConstantValues(const std::vector<Function*>& funcs,
                                 const std::vector<Call*>& calls,
                                 const std::vector<CallRef*>& callRefs,
                                 Module* module) {
  assert(funcs.size() > 0);
  auto* first = funcs[0];
#ifndef NDEBUG
  for (auto* func : funcs) {
    assert(func->type == first->type);
  }
#endif

  SortedVector optimized;
  auto numParams = first->getNumParams();
  for (Index i = 0; i < numParams; i++) {
    PossibleConstantValues value;
    for (auto* call : calls) {
      value.note(call->operands[i], *module);
      if (!value.isConstant()) {
        break;
      }
    }
    for (auto* call : callRefs) {
      value.note(call->operands[i], *module);
      if (!value.isConstant()) {
        break;
      }
    }
    if (!value.isConstant()) {
      continue;
    }

    // Optimize: write the constant value in the function bodies, making them
    // ignore the parameter's value.
    Builder builder(*module);
    for (auto* func : funcs) {
      func->body = builder.makeSequence(
        builder.makeLocalSet(i, value.makeExpression(*module)), func->body);
    }
    optimized.insert(i);
  }

  return optimized;
}